

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

void gdImageFillToBorder(gdImagePtr im,int x,int y,int border,int color)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int x_00;
  
  if (-1 < border) {
    iVar1 = im->alphaBlendingFlag;
    im->alphaBlendingFlag = 0;
    iVar4 = x;
    x_00 = -1;
    while ((iVar5 = iVar4, -1 < iVar5 && (iVar4 = gdImageGetPixel(im,iVar5,y), iVar4 != border))) {
      gdImageSetPixel(im,iVar5,y,color);
      iVar4 = iVar5 + -1;
      x_00 = iVar5;
    }
    if (x_00 != -1) {
      while ((iVar4 = x + 1, iVar4 < im->sx &&
             (iVar5 = gdImageGetPixel(im,iVar4,y), iVar5 != border))) {
        gdImageSetPixel(im,iVar4,y,color);
        x = iVar4;
      }
      if (0 < y) {
        bVar2 = true;
        for (iVar4 = x_00; iVar4 <= x; iVar4 = iVar4 + 1) {
          iVar5 = gdImageGetPixel(im,iVar4,y + -1);
          bVar3 = iVar5 == color || iVar5 == border;
          if ((bVar2) && (bVar3 = true, iVar5 != color && iVar5 != border)) {
            gdImageFillToBorder(im,iVar4,y + -1,border,color);
            bVar3 = false;
          }
          bVar2 = bVar3;
        }
      }
      if (y < im->sy + -1) {
        bVar2 = true;
        for (; x_00 <= x; x_00 = x_00 + 1) {
          iVar4 = gdImageGetPixel(im,x_00,y + 1);
          bVar3 = iVar4 == color || iVar4 == border;
          if ((bVar2) && (bVar3 = true, iVar4 != color && iVar4 != border)) {
            gdImageFillToBorder(im,x_00,y + 1,border,color);
            bVar3 = false;
          }
          bVar2 = bVar3;
        }
      }
    }
    im->alphaBlendingFlag = iVar1;
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFillToBorder (gdImagePtr im, int x, int y, int border, int color)
{
	int lastBorder;
	/* Seek left */
	int leftLimit, rightLimit;
	int i;
	int restoreAlphaBleding;

	if (border < 0) {
		/* Refuse to fill to a non-solid border */
		return;
	}

	leftLimit = (-1);

	restoreAlphaBleding = im->alphaBlendingFlag;
	im->alphaBlendingFlag = 0;

	for (i = x; (i >= 0); i--) {
		if (gdImageGetPixel (im, i, y) == border) {
			break;
		}
		gdImageSetPixel (im, i, y, color);
		leftLimit = i;
	}
	if (leftLimit == (-1)) {
		im->alphaBlendingFlag = restoreAlphaBleding;
		return;
	}
	/* Seek right */
	rightLimit = x;
	for (i = (x + 1); (i < im->sx); i++) {
		if (gdImageGetPixel (im, i, y) == border) {
			break;
		}
		gdImageSetPixel (im, i, y, color);
		rightLimit = i;
	}
	/* Look at lines above and below and start paints */
	/* Above */
	if (y > 0) {
		lastBorder = 1;
		for (i = leftLimit; (i <= rightLimit); i++) {
			int c;
			c = gdImageGetPixel (im, i, y - 1);
			if (lastBorder) {
				if ((c != border) && (c != color)) {
					gdImageFillToBorder (im, i, y - 1, border, color);
					lastBorder = 0;
				}
			} else if ((c == border) || (c == color)) {
				lastBorder = 1;
			}
		}
	}
	/* Below */
	if (y < ((im->sy) - 1)) {
		lastBorder = 1;
		for (i = leftLimit; (i <= rightLimit); i++) {
			int c = gdImageGetPixel (im, i, y + 1);
			if (lastBorder) {
				if ((c != border) && (c != color)) {
					gdImageFillToBorder (im, i, y + 1, border, color);
					lastBorder = 0;
				}
			} else if ((c == border) || (c == color)) {
				lastBorder = 1;
			}
		}
	}
	im->alphaBlendingFlag = restoreAlphaBleding;
}